

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall AI::putChess(AI *this,int i,int j,int who)

{
  pair<int,_int> *ppVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  pair<int,_int> *dir;
  pair<int,_int> *ppVar6;
  
  if (-1 < i) {
    uVar3 = (ulong)(uint)i;
    if (((-1 < j && uVar3 < this->boardSize) && (uVar4 = (ulong)(uint)j, uVar4 < this->boardSize))
       && (*(int *)(*(long *)&(this->board->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar3].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + uVar4 * 4) == 0)) {
      ppVar6 = (this->directions).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->directions).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar6 == ppVar1) {
        bVar5 = false;
      }
      else {
        bVar5 = false;
        do {
          iVar2 = reverseDirection(this,i,j,who,*ppVar6,false);
          if (iVar2 != 0) {
            reverseDirection(this,i,j,who,*ppVar6,true);
            bVar5 = true;
          }
          ppVar6 = ppVar6 + 1;
        } while (ppVar6 != ppVar1);
      }
      if (!bVar5) {
        return bVar5;
      }
      *(int *)(*(long *)&(this->board->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar3].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + uVar4 * 4) = who;
      return true;
    }
  }
  return false;
}

Assistant:

bool AI::putChess(int i, int j, int who) {
    if (i < 0 || i >= boardSize || j < 0 || j >= boardSize) return false;
    if (board[i][j] != EMPTY) return false;
    bool flag = false;
    for (auto &dir: directions) {
        int num = reverseDirection(i, j, who, dir);
        if (num) {
            flag = true;
            reverseDirection(i, j, who, dir, true);
        }
    }
    if (flag) {
        board[i][j] = who;
    }
    return flag;
}